

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

unique_ptr<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>_>
 __thiscall cpptrace::detail::libdwarf::make_dwarf_resolver(libdwarf *this,string *object_path)

{
  string *object_path_;
  dwarf_resolver *this_00;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> local_48;
  unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>
  local_20;
  string *local_18;
  string *object_path_local;
  
  local_18 = object_path;
  object_path_local = (string *)this;
  this_00 = (dwarf_resolver *)operator_new(0x170);
  object_path_ = local_18;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0>::optional();
  dwarf_resolver::dwarf_resolver(this_00,object_path_,&local_48);
  std::
  unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>
  ::unique_ptr<std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>,void>
            ((unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>
              *)&local_20,this_00);
  std::
  unique_ptr<cpptrace::detail::libdwarf::symbol_resolver,std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>>
  ::
  unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>,void>
            ((unique_ptr<cpptrace::detail::libdwarf::symbol_resolver,std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>>
              *)this,&local_20);
  std::
  unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>
  ::~unique_ptr(&local_20);
  optional<cpptrace::detail::libdwarf::skeleton_info,_0>::~optional(&local_48);
  return (__uniq_ptr_data<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>,_true,_true>
          )(__uniq_ptr_data<cpptrace::detail::libdwarf::symbol_resolver,_std::default_delete<cpptrace::detail::libdwarf::symbol_resolver>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<symbol_resolver> make_dwarf_resolver(const std::string& object_path) {
        return std::unique_ptr<dwarf_resolver>(new dwarf_resolver(object_path));
    }